

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O3

int32_t adt_u32List_length(adt_u32List_t *self)

{
  int iVar1;
  
  if (self != (adt_u32List_t *)0x0) {
    iVar1 = -1;
    do {
      self = (adt_u32List_t *)((adt_u32List_elem_t *)self)->pNext;
      iVar1 = iVar1 + 1;
    } while ((adt_u32List_elem_t *)self != (adt_u32List_elem_t *)0x0);
    return iVar1;
  }
  return 0;
}

Assistant:

int32_t adt_u32List_length(const adt_u32List_t *self)
{
   int32_t result=0;
   if (self != 0)
   {
      adt_u32List_elem_t *iter = self->pFirst;
      while(iter != 0)
      {
         ++result;
         iter = iter->pNext;
      }
   }
   return result;
}